

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown34_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 *puVar3;
  undefined1 *puVar4;
  uvec8 auVar5;
  uvec8 auVar6;
  uvec8 auVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar7 = libyuv::kShuf2;
  auVar6 = libyuv::kShuf1;
  auVar5 = libyuv::kShuf0;
  do {
    puVar3 = *(undefined1 (*) [32])src_ptr;
    puVar4 = *(undefined1 (*) [32])src_ptr;
    auVar2 = *(undefined1 (*) [32])src_ptr;
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar9 = pshufb(*(undefined1 (*) [16])puVar3,(undefined1  [16])auVar5);
    auVar10 = pshufb(auVar2._8_16_,(undefined1  [16])auVar6);
    auVar11 = pshufb(*(undefined1 (*) [16])(puVar4 + 0x10),(undefined1  [16])auVar7);
    *(long *)dst_ptr = auVar9._0_8_;
    *(long *)(dst_ptr + 8) = auVar10._0_8_;
    *(long *)(dst_ptr + 0x10) = auVar11._0_8_;
    dst_ptr = dst_ptr + 0x18;
    iVar8 = dst_width + -0x18;
    bVar1 = 0x17 < dst_width;
    dst_width = iVar8;
  } while (iVar8 != 0 && bVar1);
  return;
}

Assistant:

void ScaleRowDown34_SSSE3(const uint8_t* src_ptr,
                          ptrdiff_t src_stride,
                          uint8_t* dst_ptr,
                          int dst_width) {
  (void)src_stride;
  asm volatile(
      "movdqa      %0,%%xmm3                     \n"
      "movdqa      %1,%%xmm4                     \n"
      "movdqa      %2,%%xmm5                     \n"
      :
      : "m"(kShuf0),  // %0
        "m"(kShuf1),  // %1
        "m"(kShuf2)   // %2
  );
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm2               \n"
      "lea         0x20(%0),%0                   \n"
      "movdqa      %%xmm2,%%xmm1                 \n"
      "palignr     $0x8,%%xmm0,%%xmm1            \n"
      "pshufb      %%xmm3,%%xmm0                 \n"
      "pshufb      %%xmm4,%%xmm1                 \n"
      "pshufb      %%xmm5,%%xmm2                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "movq        %%xmm1,0x8(%1)                \n"
      "movq        %%xmm2,0x10(%1)               \n"
      "lea         0x18(%1),%1                   \n"
      "sub         $0x18,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}